

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O3

void av1_free_svc_cyclic_refresh(AV1_COMP *cpi)

{
  LAYER_CONTEXT *pLVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  iVar4 = (cpi->svc).number_spatial_layers;
  if (0 < iVar4) {
    iVar2 = (cpi->svc).number_temporal_layers;
    iVar5 = 0;
    do {
      if (0 < iVar2) {
        lVar6 = 0;
        do {
          pLVar1 = (cpi->svc).layer_context;
          lVar3 = iVar2 * iVar5 + lVar6;
          aom_free(pLVar1[lVar3].map);
          pLVar1[lVar3].map = (int8_t *)0x0;
          iVar2 = (cpi->svc).number_temporal_layers;
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 < iVar2);
        iVar4 = (cpi->svc).number_spatial_layers;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < iVar4);
  }
  return;
}

Assistant:

void av1_free_svc_cyclic_refresh(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
    for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
      int layer = LAYER_IDS_TO_IDX(sl, tl, svc->number_temporal_layers);
      LAYER_CONTEXT *const lc = &svc->layer_context[layer];
      aom_free(lc->map);
      lc->map = NULL;
    }
  }
}